

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

float rsg::BlockStatement::getWeight(GeneratorState *state)

{
  bool bVar1;
  int iVar2;
  ShaderParameters *pSVar3;
  GeneratorState *state_local;
  
  iVar2 = GeneratorState::getStatementDepth(state);
  pSVar3 = GeneratorState::getShaderParameters(state);
  if (iVar2 + 1 < pSVar3->maxStatementDepth) {
    bVar1 = anon_unknown_0::isCurrentTopStatementBlock(state);
    if (bVar1) {
      state_local._4_4_ = 0.2;
    }
    else {
      state_local._4_4_ = 1.0;
    }
  }
  else {
    state_local._4_4_ = 0.0;
  }
  return state_local._4_4_;
}

Assistant:

float BlockStatement::getWeight (const GeneratorState& state)
{
	if (state.getStatementDepth()+1 < state.getShaderParameters().maxStatementDepth)
	{
		if (isCurrentTopStatementBlock(state))
			return 0.2f; // Low probability for anonymous blocks.
		else
			return 1.0f;
	}
	else
		return 0.0f;
}